

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decAbc.c
# Opt level: O2

Hop_Obj_t * Dec_GraphFactorSop(Hop_Man_t *pMan,char *pSop)

{
  Dec_Node_t *pDVar1;
  Dec_Graph_t *pGraph;
  Hop_Obj_t *pHVar2;
  long lVar3;
  long lVar4;
  
  pGraph = Dec_Factor(pSop);
  lVar3 = 8;
  for (lVar4 = 0; lVar4 < pGraph->nLeaves; lVar4 = lVar4 + 1) {
    pDVar1 = pGraph->pNodes;
    pHVar2 = Hop_IthVar(pMan,(int)lVar4);
    *(Hop_Obj_t **)(&(pDVar1->eEdge0).field_0x0 + lVar3) = pHVar2;
    lVar3 = lVar3 + 0x18;
  }
  pHVar2 = Dec_GraphToNetworkAig(pMan,pGraph);
  Dec_GraphFree(pGraph);
  return pHVar2;
}

Assistant:

Hop_Obj_t * Dec_GraphFactorSop( Hop_Man_t * pMan, char * pSop )
{
    Hop_Obj_t * pFunc;
    Dec_Graph_t * pFForm;
    Dec_Node_t * pNode;
    int i;
    // perform factoring
    pFForm = Dec_Factor( pSop );
    // collect the fanins
    Dec_GraphForEachLeaf( pFForm, pNode, i )
        pNode->pFunc = Hop_IthVar( pMan, i );
    // perform strashing
    pFunc = Dec_GraphToNetworkAig( pMan, pFForm );
    Dec_GraphFree( pFForm );
    return pFunc;
}